

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

string * RequestMethodString_abi_cxx11_(string *__return_storage_ptr__,RequestMethod m)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(m) {
  case UNKNOWN:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0087fc0f:
      __stack_chk_fail();
    }
    pcVar3 = "unknown";
    pcVar2 = "";
    break;
  case GET:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0087fc0f;
    pcVar3 = "GET";
    pcVar2 = "";
    break;
  case POST:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0087fc0f;
    pcVar3 = "POST";
    pcVar2 = "";
    break;
  case HEAD:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0087fc0f;
    pcVar3 = "HEAD";
    pcVar2 = "";
    break;
  case PUT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0087fc0f;
    pcVar3 = "PUT";
    pcVar2 = "";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                  ,0x104,"std::string RequestMethodString(HTTPRequest::RequestMethod)");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string RequestMethodString(HTTPRequest::RequestMethod m)
{
    switch (m) {
    case HTTPRequest::GET:
        return "GET";
    case HTTPRequest::POST:
        return "POST";
    case HTTPRequest::HEAD:
        return "HEAD";
    case HTTPRequest::PUT:
        return "PUT";
    case HTTPRequest::UNKNOWN:
        return "unknown";
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}